

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationTests.cpp
# Opt level: O3

void vkt::synchronization::anon_unknown_1::createChildren(TestCaseGroup *group)

{
  TestContext *textCtx;
  TestNode *pTVar1;
  TestGroupHelper0 *this;
  string local_68;
  string local_48;
  
  textCtx = (group->super_TestNode).m_testCtx;
  pTVar1 = &createSmokeTests(textCtx)->super_TestNode;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"basic","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"Basic synchronization tests","");
  this = (TestGroupHelper0 *)operator_new(0x78);
  TestGroupHelper0::TestGroupHelper0(this,textCtx,&local_48,&local_68,createBasicTests);
  tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pTVar1 = (TestNode *)operator_new(0x90);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,textCtx,"op","Synchronization of a memory-modifying operation")
  ;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__OperationTests_00d017b8;
  PipelineCacheData::PipelineCacheData((PipelineCacheData *)(pTVar1 + 1));
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  pTVar1 = &createInternallySynchronizedObjects(textCtx)->super_TestNode;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  return;
}

Assistant:

void createChildren (tcu::TestCaseGroup* group)
{
	tcu::TestContext& testCtx = group->getTestContext();

	group->addChild(createSmokeTests(testCtx));
	group->addChild(createTestGroup	(testCtx, "basic", "Basic synchronization tests", createBasicTests));
	group->addChild(new OperationTests(testCtx));
	group->addChild(createInternallySynchronizedObjects(testCtx));
}